

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::checkRemoveSemaphoreInfo(CLIntercept *this,cl_semaphore_khr semaphore)

{
  bool bVar1;
  cl_int cVar2;
  pointer ppVar3;
  CLdispatchX *pCVar4;
  iterator __position;
  cl_semaphore_khr in_RSI;
  cl_int errorCode;
  cl_uint refCount;
  CLdispatchX *dispatchX;
  cl_platform_id platform;
  iterator iter;
  lock_guard<std::mutex> lock;
  string *in_stack_00000518;
  cl_platform_id in_stack_00000520;
  CLIntercept *in_stack_00000528;
  map<_cl_semaphore_khr_*,__cl_platform_id_*,_std::less<_cl_semaphore_khr_*>,_std::allocator<std::pair<_cl_semaphore_khr_*const,__cl_platform_id_*>_>_>
  *in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  cl_platform_id in_stack_ffffffffffffff50;
  CLIntercept *in_stack_ffffffffffffff58;
  int local_74;
  CLdispatchX *local_70;
  undefined1 local_61 [41];
  _Self local_38 [3];
  _Self local_20 [2];
  cl_semaphore_khr local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
             ,(mutex_type *)in_stack_ffffffffffffff38);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<_cl_semaphore_khr_*,__cl_platform_id_*,_std::less<_cl_semaphore_khr_*>,_std::allocator<std::pair<_cl_semaphore_khr_*const,__cl_platform_id_*>_>_>
       ::find(in_stack_ffffffffffffff38,(key_type *)0x209f9e);
  local_38[0]._M_node =
       (_Base_ptr)
       std::
       map<_cl_semaphore_khr_*,__cl_platform_id_*,_std::less<_cl_semaphore_khr_*>,_std::allocator<std::pair<_cl_semaphore_khr_*const,__cl_platform_id_*>_>_>
       ::end(in_stack_ffffffffffffff38);
  bVar1 = std::operator!=(local_20,local_38);
  if (bVar1) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<_cl_semaphore_khr_*const,__cl_platform_id_*>_>::
             operator->((_Rb_tree_iterator<std::pair<_cl_semaphore_khr_*const,__cl_platform_id_*>_>
                         *)0x209ff6);
    local_61._33_8_ = ppVar3->second;
    pCVar4 = CLIntercept::dispatchX(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    if (pCVar4->clGetSemaphoreInfoKHR ==
        (_func_cl_int_cl_semaphore_khr_cl_semaphore_info_khr_size_t_void_ptr_size_t_ptr *)0x0) {
      in_stack_ffffffffffffff58 = (CLIntercept *)local_61;
      in_stack_ffffffffffffff50 = (cl_platform_id)local_61._33_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_61 + 1),"clGetSemaphoreInfoKHR",
                 (allocator *)in_stack_ffffffffffffff58);
      getExtensionFunctionAddress(in_stack_00000528,in_stack_00000520,in_stack_00000518);
      std::__cxx11::string::~string((string *)(local_61 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_61);
    }
    __position._M_node =
         (_Base_ptr)CLIntercept::dispatchX(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    local_70 = (CLdispatchX *)__position._M_node;
    if (((CLdispatchX *)__position._M_node)->clGetSemaphoreInfoKHR !=
        (_func_cl_int_cl_semaphore_khr_cl_semaphore_info_khr_size_t_void_ptr_size_t_ptr *)0x0) {
      local_74 = 0;
      cVar2 = (*((CLdispatchX *)__position._M_node)->clGetSemaphoreInfoKHR)
                        (local_10,0x203a,4,&local_74,(size_t *)0x0);
      if ((cVar2 == 0) && (local_74 == 1)) {
        std::
        map<_cl_semaphore_khr*,_cl_platform_id*,std::less<_cl_semaphore_khr*>,std::allocator<std::pair<_cl_semaphore_khr*const,_cl_platform_id*>>>
        ::erase_abi_cxx11_((map<_cl_semaphore_khr_*,__cl_platform_id_*,_std::less<_cl_semaphore_khr_*>,_std::allocator<std::pair<_cl_semaphore_khr_*const,__cl_platform_id_*>_>_>
                            *)(ulong)in_stack_ffffffffffffff40,__position);
      }
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20a1b9);
  return;
}

Assistant:

void CLIntercept::checkRemoveSemaphoreInfo(
    cl_semaphore_khr semaphore )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CSemaphoreInfoMap::iterator iter = m_SemaphoreInfoMap.find( semaphore );
    if( iter != m_SemaphoreInfoMap.end() )
    {
        cl_platform_id  platform = iter->second;
        if( dispatchX(platform).clGetSemaphoreInfoKHR == NULL )
        {
            getExtensionFunctionAddress(
                platform,
                "clGetSemaphoreInfoKHR" );
        }

        const auto& dispatchX = this->dispatchX(platform);
        if( dispatchX.clGetSemaphoreInfoKHR )
        {
            cl_uint refCount = 0;
            cl_int  errorCode = CL_SUCCESS;
            errorCode = dispatchX.clGetSemaphoreInfoKHR(
                semaphore,
                CL_SEMAPHORE_REFERENCE_COUNT_KHR,
                sizeof( refCount ),
                &refCount,
                NULL );
            if( errorCode == CL_SUCCESS && refCount == 1 )
            {
                m_SemaphoreInfoMap.erase( iter );
            }
        }
    }
}